

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O3

RC __thiscall PF_BufferMgr::ReadPage(PF_BufferMgr *this,int fd,PageNum pageNum,char *dest)

{
  RC RVar1;
  __off_t _Var2;
  ssize_t sVar3;
  
  StatisticsMgr::Register(pStatisticsMgr,PF_READPAGE,STAT_ADDONE,(int *)0x0);
  _Var2 = lseek(fd,(long)this->pageSize * (long)pageNum + 0x1000,0);
  if (_Var2 < 0) {
    RVar1 = -0xb;
  }
  else {
    sVar3 = read(fd,dest,(long)this->pageSize);
    RVar1 = -0xb;
    if (-1 < (int)sVar3) {
      RVar1 = (uint)(this->pageSize == (int)sVar3) * 3 + -3;
    }
  }
  return RVar1;
}

Assistant:

RC PF_BufferMgr::ReadPage(int fd, PageNum pageNum, char *dest)
{

#ifdef PF_LOG
   char psMessage[100];
   sprintf (psMessage, "Reading (%d,%d).\n", fd, pageNum);
   WriteLog(psMessage);
#endif

#ifdef PF_STATS
   pStatisticsMgr->Register(PF_READPAGE, STAT_ADDONE);
#endif

   // seek to the appropriate place (cast to long for PC's)
   long offset = pageNum * (long)pageSize + PF_FILE_HDR_SIZE;
   if (lseek(fd, offset, L_SET) < 0)
      return (PF_UNIX);

   // Read the data
   int numBytes = read(fd, dest, pageSize);
   if (numBytes < 0)
      return (PF_UNIX);
   else if (numBytes != pageSize)
      return (PF_INCOMPLETEREAD);
   else
      return (0);
}